

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opencv_interop.hpp
# Opt level: O0

core * __thiscall eos::core::to_mat(core *this,Image4u *image)

{
  uchar v0;
  uchar v1;
  uchar v2;
  int iVar1;
  int iVar2;
  Pixel<unsigned_char,_4> *pPVar3;
  uchar *puVar4;
  Vec<unsigned_char,_4> *pVVar5;
  Vec<unsigned_char,_4> local_28;
  int local_24;
  int local_20;
  int r;
  int c;
  Image4u *image_local;
  Mat *opencv_matrix;
  
  r._3_1_ = 0;
  _c = image;
  image_local = (Image4u *)this;
  iVar1 = Image<eos::core::Pixel<unsigned_char,_4>_>::height(image);
  iVar2 = Image<eos::core::Pixel<unsigned_char,_4>_>::width(_c);
  cv::Mat::Mat((Mat *)this,iVar1,iVar2,0x18);
  for (local_20 = 0; iVar1 = local_20, iVar2 = Image<eos::core::Pixel<unsigned_char,_4>_>::width(_c)
      , iVar1 < iVar2; local_20 = local_20 + 1) {
    for (local_24 = 0; iVar1 = local_24,
        iVar2 = Image<eos::core::Pixel<unsigned_char,_4>_>::height(_c), iVar1 < iVar2;
        local_24 = local_24 + 1) {
      pPVar3 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(_c,local_24,local_20);
      puVar4 = Pixel<unsigned_char,_4>::operator[](pPVar3,0);
      v0 = *puVar4;
      pPVar3 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(_c,local_24,local_20);
      puVar4 = Pixel<unsigned_char,_4>::operator[](pPVar3,1);
      v1 = *puVar4;
      pPVar3 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(_c,local_24,local_20);
      puVar4 = Pixel<unsigned_char,_4>::operator[](pPVar3,2);
      v2 = *puVar4;
      pPVar3 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(_c,local_24,local_20);
      puVar4 = Pixel<unsigned_char,_4>::operator[](pPVar3,3);
      cv::Vec<unsigned_char,_4>::Vec(&local_28,v0,v1,v2,*puVar4);
      pVVar5 = cv::Mat::at<cv::Vec<unsigned_char,4>>((Mat *)this,local_24,local_20);
      *(Matx<unsigned_char,_4,_1> *)(pVVar5->super_Matx<unsigned_char,_4,_1>).val =
           local_28.super_Matx<unsigned_char,_4,_1>.val;
    }
  }
  return this;
}

Assistant:

inline cv::Mat to_mat(const Image4u& image)
{
    cv::Mat opencv_matrix(static_cast<int>(image.height()), static_cast<int>(image.width()), CV_8UC4);
    for (int c = 0; c < image.width(); ++c)
    { // size_t
        for (int r = 0; r < image.height(); ++r)
        {
            // auto vals = image(r, c);
            opencv_matrix.at<cv::Vec4b>(r, c) =
                cv::Vec4b(image(r, c)[0], image(r, c)[1], image(r, c)[2], image(r, c)[3]);
        }
    }
    return opencv_matrix;
}